

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_checkbox(nk_command_buffer *out,nk_flags state,nk_style_toggle *style,int active,
                     nk_rect *label,nk_rect *selector,nk_rect *cursors,char *string,int len,
                     nk_user_font *font)

{
  nk_rect rect;
  undefined1 local_58 [8];
  nk_text text;
  nk_style_item *cursor;
  nk_style_item *background;
  nk_rect *selector_local;
  nk_rect *label_local;
  int active_local;
  nk_style_toggle *style_local;
  nk_flags state_local;
  nk_command_buffer *out_local;
  
  if ((state & 0x10) == 0) {
    if ((state & 0x20) == 0) {
      text._8_8_ = &style->cursor_normal;
      text.padding.y = *(float *)&style->text_normal;
      cursor = &style->normal;
    }
    else {
      cursor = &style->hover;
      text._8_8_ = &style->cursor_hover;
      text.padding.y = *(float *)&style->text_active;
    }
  }
  else {
    cursor = &style->hover;
    text._8_8_ = &style->cursor_hover;
    text.padding.y = *(float *)&style->text_hover;
  }
  if (cursor->type == NK_STYLE_ITEM_COLOR) {
    nk_fill_rect(out,*selector,0.0,style->border_color);
    rect = nk_shrink_rect(*selector,style->border);
    nk_fill_rect(out,rect,0.0,(cursor->data).color);
  }
  else {
    nk_draw_image(out,*selector,&(cursor->data).image,(nk_color)0xffffffff);
  }
  if (active != 0) {
    if (*(int *)text._8_8_ == 1) {
      nk_draw_image(out,*cursors,(nk_image *)(text._8_8_ + 8),(nk_color)0xffffffff);
    }
    else {
      nk_fill_rect(out,*cursors,0.0,*(nk_color *)(text._8_8_ + 8));
    }
  }
  local_58._0_4_ = 0.0;
  local_58._4_4_ = 0.0;
  text.padding.x = *(float *)&style->text_background;
  nk_widget_text(out,*label,string,len,(nk_text *)local_58,0x11,font);
  return;
}

Assistant:

NK_LIB void
nk_draw_checkbox(struct nk_command_buffer *out,
    nk_flags state, const struct nk_style_toggle *style, int active,
    const struct nk_rect *label, const struct nk_rect *selector,
    const struct nk_rect *cursors, const char *string, int len,
    const struct nk_user_font *font)
{
    const struct nk_style_item *background;
    const struct nk_style_item *cursor;
    struct nk_text text;

    /* select correct colors/images */
    if (state & NK_WIDGET_STATE_HOVER) {
        background = &style->hover;
        cursor = &style->cursor_hover;
        text.text = style->text_hover;
    } else if (state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->hover;
        cursor = &style->cursor_hover;
        text.text = style->text_active;
    } else {
        background = &style->normal;
        cursor = &style->cursor_normal;
        text.text = style->text_normal;
    }

    /* draw background and cursor */
    if (background->type == NK_STYLE_ITEM_COLOR) {
        nk_fill_rect(out, *selector, 0, style->border_color);
        nk_fill_rect(out, nk_shrink_rect(*selector, style->border), 0, background->data.color);
    } else nk_draw_image(out, *selector, &background->data.image, nk_white);
    if (active) {
        if (cursor->type == NK_STYLE_ITEM_IMAGE)
            nk_draw_image(out, *cursors, &cursor->data.image, nk_white);
        else nk_fill_rect(out, *cursors, 0, cursor->data.color);
    }

    text.padding.x = 0;
    text.padding.y = 0;
    text.background = style->text_background;
    nk_widget_text(out, *label, string, len, &text, NK_TEXT_LEFT, font);
}